

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  int iVar56;
  int iVar57;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar58;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [64];
  vint4 bi;
  vint4 bi_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 bi_1;
  undefined1 auVar62 [16];
  vint4 ai_1;
  vint4 ai_3;
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1078 [16];
  Intersectors *local_1068;
  size_t local_1060;
  Precalculations *local_1058;
  RayHitK<4> *local_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 local_1028;
  undefined4 uStack_1024;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1058 = pre;
  local_1068 = This;
  pauVar13 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_f88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar71 = ZEXT1664(local_f88);
  local_f98 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar72 = ZEXT1664(local_f98);
  local_fa8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar73 = ZEXT1664(local_fa8);
  local_1028 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_1024 = local_1028;
  uStack_1020 = local_1028;
  uStack_101c = local_1028;
  local_1038 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_1034 = local_1038;
  uStack_1030 = local_1038;
  uStack_102c = local_1038;
  local_1048 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_fb8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * 0.99999964)));
  auVar74 = ZEXT1664(local_fb8);
  local_fc8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar75 = ZEXT1664(local_fc8);
  local_fd8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar76 = ZEXT1664(local_fd8);
  local_fe8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * 1.0000004)));
  auVar77 = ZEXT1664(local_fe8);
  local_ff8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 1.0000004)));
  auVar78 = ZEXT1664(local_ff8);
  local_1008 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 1.0000004)));
  auVar79 = ZEXT1664(local_1008);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1018 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar80 = ZEXT1664(local_1018);
  iVar23 = (tray->tfar).field_0.i[k];
  auVar59 = ZEXT1664(CONCAT412(iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23))));
  local_1050 = ray;
  local_1060 = k;
  do {
    pauVar12 = pauVar13 + -1;
    pauVar13 = pauVar13 + -1;
    if (*(float *)((long)*pauVar12 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar22 = *(ulong *)*pauVar13;
      while ((uVar22 & 8) == 0) {
        fVar1 = *(float *)(ray + k * 4 + 0x70);
        uVar15 = (uint)uVar22 & 7;
        uVar14 = uVar22 & 0xfffffffffffffff0;
        auVar27 = auVar71._0_16_;
        auVar28 = auVar72._0_16_;
        auVar41 = auVar73._0_16_;
        if (uVar15 == 3) {
          auVar24 = *(undefined1 (*) [16])(uVar14 + 0x80);
          auVar25 = *(undefined1 (*) [16])(uVar14 + 0x90);
          auVar26 = *(undefined1 (*) [16])(uVar14 + 0xa0);
          auVar64._4_4_ = fVar1;
          auVar64._0_4_ = fVar1;
          auVar64._8_4_ = fVar1;
          auVar64._12_4_ = fVar1;
          fVar2 = 1.0 - fVar1;
          auVar67._4_4_ = fVar2;
          auVar67._0_4_ = fVar2;
          auVar67._8_4_ = fVar2;
          auVar67._12_4_ = fVar2;
          auVar40._0_4_ = fVar1 * *(float *)(uVar14 + 0xe0);
          auVar40._4_4_ = fVar1 * *(float *)(uVar14 + 0xe4);
          auVar40._8_4_ = fVar1 * *(float *)(uVar14 + 0xe8);
          auVar40._12_4_ = fVar1 * *(float *)(uVar14 + 0xec);
          auVar36._0_4_ = fVar1 * *(float *)(uVar14 + 0xf0);
          auVar36._4_4_ = fVar1 * *(float *)(uVar14 + 0xf4);
          auVar36._8_4_ = fVar1 * *(float *)(uVar14 + 0xf8);
          auVar36._12_4_ = fVar1 * *(float *)(uVar14 + 0xfc);
          auVar35._0_4_ = fVar1 * *(float *)(uVar14 + 0x100);
          auVar35._4_4_ = fVar1 * *(float *)(uVar14 + 0x104);
          auVar35._8_4_ = fVar1 * *(float *)(uVar14 + 0x108);
          auVar35._12_4_ = fVar1 * *(float *)(uVar14 + 0x10c);
          auVar29 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar30 = vfmadd231ps_avx512vl(auVar40,auVar67,auVar29);
          auVar31 = vfmadd231ps_avx512vl(auVar36,auVar67,auVar29);
          auVar69._0_4_ = fVar1 * *(float *)(uVar14 + 0x110);
          auVar69._4_4_ = fVar1 * *(float *)(uVar14 + 0x114);
          auVar69._8_4_ = fVar1 * *(float *)(uVar14 + 0x118);
          auVar69._12_4_ = fVar1 * *(float *)(uVar14 + 0x11c);
          auVar32 = vmulps_avx512vl(auVar64,*(undefined1 (*) [16])(uVar14 + 0x120));
          auVar33 = vfmadd231ps_avx512vl(auVar35,auVar67,auVar29);
          auVar65._0_4_ = fVar1 * *(float *)(uVar14 + 0x130);
          auVar65._4_4_ = fVar1 * *(float *)(uVar14 + 0x134);
          auVar65._8_4_ = fVar1 * *(float *)(uVar14 + 0x138);
          auVar65._12_4_ = fVar1 * *(float *)(uVar14 + 0x13c);
          auVar34 = vaddps_avx512vl(auVar67,auVar69);
          auVar35 = vaddps_avx512vl(auVar67,auVar32);
          in_ZMM17 = ZEXT1664(auVar35);
          auVar36 = vaddps_avx512vl(auVar67,auVar65);
          auVar70._0_4_ = local_1048 * auVar24._0_4_;
          auVar70._4_4_ = fStack_1044 * auVar24._4_4_;
          auVar70._8_4_ = fStack_1040 * auVar24._8_4_;
          auVar70._12_4_ = fStack_103c * auVar24._12_4_;
          auVar66._0_4_ = local_1048 * auVar25._0_4_;
          auVar66._4_4_ = fStack_1044 * auVar25._4_4_;
          auVar66._8_4_ = fStack_1040 * auVar25._8_4_;
          auVar66._12_4_ = fStack_103c * auVar25._12_4_;
          auVar68._0_4_ = local_1048 * auVar26._0_4_;
          auVar68._4_4_ = fStack_1044 * auVar26._4_4_;
          auVar68._8_4_ = fStack_1040 * auVar26._8_4_;
          auVar68._12_4_ = fStack_103c * auVar26._12_4_;
          auVar29._4_4_ = uStack_1034;
          auVar29._0_4_ = local_1038;
          auVar29._8_4_ = uStack_1030;
          auVar29._12_4_ = uStack_102c;
          auVar37 = vfmadd231ps_avx512vl(auVar70,auVar29,*(undefined1 (*) [16])(uVar14 + 0x50));
          auVar38 = vfmadd231ps_avx512vl(auVar66,auVar29,*(undefined1 (*) [16])(uVar14 + 0x60));
          auVar29 = vfmadd231ps_avx512vl(auVar68,auVar29,*(undefined1 (*) [16])(uVar14 + 0x70));
          auVar32._4_4_ = uStack_1024;
          auVar32._0_4_ = local_1028;
          auVar32._8_4_ = uStack_1020;
          auVar32._12_4_ = uStack_101c;
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar32,*(undefined1 (*) [16])(uVar14 + 0x20));
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar32,*(undefined1 (*) [16])(uVar14 + 0x30));
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar32,*(undefined1 (*) [16])(uVar14 + 0x40));
          auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar39 = vandps_avx512vl(auVar37,auVar32);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          uVar22 = vcmpps_avx512vl(auVar39,auVar40,1);
          bVar6 = (bool)((byte)uVar22 & 1);
          iVar23 = auVar40._0_4_;
          auVar39._0_4_ = (uint)bVar6 * iVar23 | (uint)!bVar6 * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
          iVar56 = auVar40._4_4_;
          auVar39._4_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
          iVar57 = auVar40._8_4_;
          iVar58 = auVar40._12_4_;
          auVar39._8_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar39._12_4_ = (uint)bVar6 * iVar58 | (uint)!bVar6 * auVar37._12_4_;
          auVar37 = vandps_avx512vl(auVar38,auVar32);
          uVar22 = vcmpps_avx512vl(auVar37,auVar40,1);
          bVar6 = (bool)((byte)uVar22 & 1);
          auVar37._0_4_ = (uint)bVar6 * iVar23 | (uint)!bVar6 * auVar38._0_4_;
          bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar38._4_4_;
          bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar38._8_4_;
          bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar6 * iVar58 | (uint)!bVar6 * auVar38._12_4_;
          auVar32 = vandps_avx512vl(auVar29,auVar32);
          uVar22 = vcmpps_avx512vl(auVar32,auVar40,1);
          bVar6 = (bool)((byte)uVar22 & 1);
          auVar38._0_4_ = (uint)bVar6 * iVar23 | (uint)!bVar6 * auVar29._0_4_;
          bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar29._4_4_;
          bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar29._8_4_;
          bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar6 * iVar58 | (uint)!bVar6 * auVar29._12_4_;
          auVar29 = vrcp14ps_avx512vl(auVar39);
          auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar39 = vfnmadd213ps_avx512vl(auVar39,auVar29,auVar32);
          auVar29 = vfmadd132ps_avx512vl(auVar39,auVar29,auVar29);
          auVar39 = vrcp14ps_avx512vl(auVar37);
          auVar37 = vfnmadd213ps_avx512vl(auVar37,auVar39,auVar32);
          auVar37 = vfmadd132ps_avx512vl(auVar37,auVar39,auVar39);
          auVar39 = vrcp14ps_avx512vl(auVar38);
          auVar32 = vfnmadd213ps_avx512vl(auVar38,auVar39,auVar32);
          auVar32 = vfmadd132ps_avx512vl(auVar32,auVar39,auVar39);
          auVar24 = vfmadd213ps_avx512vl(auVar24,auVar41,*(undefined1 (*) [16])(uVar14 + 0xb0));
          auVar24 = vfmadd231ps_avx512vl(auVar24,auVar28,*(undefined1 (*) [16])(uVar14 + 0x50));
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar41,*(undefined1 (*) [16])(uVar14 + 0xc0));
          auVar25 = vfmadd231ps_avx512vl(auVar25,auVar28,*(undefined1 (*) [16])(uVar14 + 0x60));
          auVar41 = vfmadd213ps_avx512vl(auVar26,auVar41,*(undefined1 (*) [16])(uVar14 + 0xd0));
          auVar28 = vfmadd231ps_avx512vl(auVar41,auVar28,*(undefined1 (*) [16])(uVar14 + 0x70));
          auVar41 = vfmadd231ps_avx512vl(auVar24,auVar27,*(undefined1 (*) [16])(uVar14 + 0x20));
          auVar24 = vfmadd231ps_avx512vl(auVar25,auVar27,*(undefined1 (*) [16])(uVar14 + 0x30));
          auVar25 = vfmadd231ps_avx512vl(auVar28,auVar27,*(undefined1 (*) [16])(uVar14 + 0x40));
          auVar27 = vsubps_avx(auVar30,auVar41);
          auVar26 = vsubps_avx512vl(auVar34,auVar41);
          auVar28 = vsubps_avx(auVar31,auVar24);
          auVar24 = vsubps_avx512vl(auVar35,auVar24);
          auVar41 = vsubps_avx(auVar33,auVar25);
          auVar25 = vsubps_avx512vl(auVar36,auVar25);
          auVar31._0_4_ = auVar29._0_4_ * auVar27._0_4_;
          auVar31._4_4_ = auVar29._4_4_ * auVar27._4_4_;
          auVar31._8_4_ = auVar29._8_4_ * auVar27._8_4_;
          auVar31._12_4_ = auVar29._12_4_ * auVar27._12_4_;
          auVar30._0_4_ = auVar29._0_4_ * auVar26._0_4_;
          auVar30._4_4_ = auVar29._4_4_ * auVar26._4_4_;
          auVar30._8_4_ = auVar29._8_4_ * auVar26._8_4_;
          auVar30._12_4_ = auVar29._12_4_ * auVar26._12_4_;
          auVar33._0_4_ = auVar37._0_4_ * auVar28._0_4_;
          auVar33._4_4_ = auVar37._4_4_ * auVar28._4_4_;
          auVar33._8_4_ = auVar37._8_4_ * auVar28._8_4_;
          auVar33._12_4_ = auVar37._12_4_ * auVar28._12_4_;
          auVar34._0_4_ = auVar32._0_4_ * auVar41._0_4_;
          auVar34._4_4_ = auVar32._4_4_ * auVar41._4_4_;
          auVar34._8_4_ = auVar32._8_4_ * auVar41._8_4_;
          auVar34._12_4_ = auVar32._12_4_ * auVar41._12_4_;
          auVar26._0_4_ = auVar37._0_4_ * auVar24._0_4_;
          auVar26._4_4_ = auVar37._4_4_ * auVar24._4_4_;
          auVar26._8_4_ = auVar37._8_4_ * auVar24._8_4_;
          auVar26._12_4_ = auVar37._12_4_ * auVar24._12_4_;
          auVar24._0_4_ = auVar32._0_4_ * auVar25._0_4_;
          auVar24._4_4_ = auVar32._4_4_ * auVar25._4_4_;
          auVar24._8_4_ = auVar32._8_4_ * auVar25._8_4_;
          auVar24._12_4_ = auVar32._12_4_ * auVar25._12_4_;
          auVar27 = vpminsd_avx(auVar33,auVar26);
          auVar28 = vpminsd_avx(auVar34,auVar24);
          auVar27 = vmaxps_avx(auVar27,auVar28);
          auVar25 = vpminsd_avx(auVar31,auVar30);
          auVar41 = vpmaxsd_avx(auVar31,auVar30);
          auVar28 = vpmaxsd_avx(auVar33,auVar26);
          auVar24 = vpmaxsd_avx(auVar34,auVar24);
          auVar28 = vminps_avx(auVar28,auVar24);
          auVar24 = vmaxps_avx512vl(auVar80._0_16_,auVar25);
          auVar27 = vmaxps_avx(auVar24,auVar27);
          auVar41 = vminps_avx(auVar59._0_16_,auVar41);
          auVar28 = vminps_avx(auVar41,auVar28);
          auVar41._8_4_ = 0x3f7ffffa;
          auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
          auVar41._12_4_ = 0x3f7ffffa;
          local_1078 = vmulps_avx512vl(auVar27,auVar41);
          auVar27._8_4_ = 0x3f800003;
          auVar27._0_8_ = 0x3f8000033f800003;
          auVar27._12_4_ = 0x3f800003;
          auVar27 = vmulps_avx512vl(auVar28,auVar27);
          uVar8 = vcmpps_avx512vl(local_1078,auVar27,2);
          uVar21 = (uint)uVar8;
        }
        else {
          auVar60._4_4_ = fVar1;
          auVar60._0_4_ = fVar1;
          auVar60._8_4_ = fVar1;
          auVar60._12_4_ = fVar1;
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar19),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + uVar19));
          auVar24 = vsubps_avx512vl(auVar24,auVar27);
          auVar25 = vmulps_avx512vl(auVar74._0_16_,auVar24);
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar17),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + uVar17));
          auVar24 = vsubps_avx512vl(auVar24,auVar28);
          auVar26 = vmulps_avx512vl(auVar75._0_16_,auVar24);
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar20),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + uVar20));
          auVar24 = vsubps_avx512vl(auVar24,auVar41);
          auVar24 = vmulps_avx512vl(auVar76._0_16_,auVar24);
          auVar24 = vmaxps_avx(auVar26,auVar24);
          auVar25 = vmaxps_avx512vl(auVar80._0_16_,auVar25);
          local_1078 = vmaxps_avx(auVar25,auVar24);
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar19 ^ 0x10)),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + (uVar19 ^ 0x10)));
          auVar27 = vsubps_avx512vl(auVar24,auVar27);
          auVar24 = vmulps_avx512vl(auVar77._0_16_,auVar27);
          auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar17 ^ 0x10)),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + (uVar17 ^ 0x10)));
          auVar27 = vsubps_avx512vl(auVar27,auVar28);
          auVar28 = vmulps_avx512vl(auVar78._0_16_,auVar27);
          auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar20 ^ 0x10)),auVar60,
                                    *(undefined1 (*) [16])(uVar14 + 0x20 + (uVar20 ^ 0x10)));
          auVar27 = vsubps_avx512vl(auVar27,auVar41);
          auVar27 = vmulps_avx512vl(auVar79._0_16_,auVar27);
          auVar27 = vminps_avx(auVar28,auVar27);
          auVar28 = vminps_avx(auVar59._0_16_,auVar24);
          auVar27 = vminps_avx(auVar28,auVar27);
          uVar8 = vcmpps_avx512vl(local_1078,auVar27,2);
          uVar21 = (uint)uVar8;
          if (uVar15 == 6) {
            uVar9 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
            uVar10 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [16])(uVar14 + 0xe0),0xd);
            uVar21 = (uint)(byte)((byte)uVar9 & (byte)uVar10 & (byte)uVar8);
          }
        }
        if ((byte)uVar21 == 0) goto LAB_006e8da9;
        lVar11 = 0;
        for (uVar22 = (ulong)(byte)uVar21; (uVar22 & 1) == 0;
            uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar22 = *(ulong *)(uVar14 + lVar11 * 8);
        uVar15 = (uVar21 & 0xff) - 1 & uVar21 & 0xff;
        uVar16 = (ulong)uVar15;
        if (uVar15 != 0) {
          uVar21 = *(uint *)(local_1078 + lVar11 * 4);
          lVar11 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar18 = (ulong)uVar15;
          uVar16 = *(ulong *)(uVar14 + lVar11 * 8);
          uVar5 = *(uint *)(local_1078 + lVar11 * 4);
          if (uVar15 == 0) {
            if (uVar21 < uVar5) {
              *(ulong *)*pauVar13 = uVar16;
              *(uint *)((long)*pauVar13 + 8) = uVar5;
              pauVar13 = pauVar13 + 1;
            }
            else {
              *(ulong *)*pauVar13 = uVar22;
              *(uint *)((long)*pauVar13 + 8) = uVar21;
              pauVar13 = pauVar13 + 1;
              uVar22 = uVar16;
            }
          }
          else {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar22;
            auVar27 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar21));
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar16;
            auVar28 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar5));
            lVar11 = 0;
            for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar22 = (ulong)uVar15;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(uVar14 + lVar11 * 8);
            auVar26 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_1078 + lVar11 * 4)));
            auVar41 = vpshufd_avx(auVar27,0xaa);
            auVar24 = vpshufd_avx(auVar28,0xaa);
            auVar25 = vpshufd_avx(auVar26,0xaa);
            if (uVar15 == 0) {
              uVar22 = vpcmpgtd_avx512vl(auVar24,auVar41);
              uVar22 = uVar22 & 0xf;
              auVar24 = vpblendmd_avx512vl(auVar28,auVar27);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar42._0_4_ = (uint)bVar6 * auVar24._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar42._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar42._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar42._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar28 = vmovdqa32_avx512vl(auVar28);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar43._0_4_ = (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar43._4_4_ = (uint)bVar6 * auVar28._4_4_ | (uint)!bVar6 * auVar27._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar43._8_4_ = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * auVar27._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar43._12_4_ = (uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar27._12_4_;
              auVar27 = vpshufd_avx(auVar42,0xaa);
              uVar14 = vpcmpgtd_avx512vl(auVar25,auVar27);
              uVar14 = uVar14 & 0xf;
              auVar28 = vpblendmd_avx512vl(auVar26,auVar42);
              bVar6 = (bool)((byte)uVar14 & 1);
              bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
              uVar22 = CONCAT44((uint)bVar7 * auVar28._4_4_ | (uint)!bVar7 * auVar27._4_4_,
                                (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_);
              auVar27 = vmovdqa32_avx512vl(auVar26);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar44._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * auVar42._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar44._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * auVar42._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar44._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * auVar42._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar44._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * auVar42._12_4_;
              auVar27 = vpshufd_avx(auVar44,0xaa);
              auVar28 = vpshufd_avx(auVar43,0xaa);
              uVar14 = vpcmpgtd_avx512vl(auVar27,auVar28);
              uVar14 = uVar14 & 0xf;
              auVar28 = vpblendmd_avx512vl(auVar44,auVar43);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar45._0_4_ = (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar45._4_4_ = (uint)bVar6 * auVar28._4_4_ | (uint)!bVar6 * auVar27._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar45._8_4_ = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * auVar27._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar45._12_4_ = (uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar27._12_4_;
              auVar27 = vmovdqa32_avx512vl(auVar44);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar46._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * auVar43._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar46._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * auVar43._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar46._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * auVar43._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar46._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * auVar43._12_4_;
              *pauVar13 = auVar46;
              pauVar13[1] = auVar45;
              pauVar13 = pauVar13 + 2;
            }
            else {
              lVar11 = 0;
              for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              uVar15 = *(uint *)(local_1078 + lVar11 * 4);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *(ulong *)(uVar14 + lVar11 * 8);
              auVar29 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar15));
              uVar22 = vpcmpgtd_avx512vl(auVar24,auVar41);
              uVar22 = uVar22 & 0xf;
              auVar24 = vpblendmd_avx512vl(auVar28,auVar27);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar47._0_4_ = (uint)bVar6 * auVar24._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar47._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar47._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar47._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar28 = vmovdqa32_avx512vl(auVar28);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar48._0_4_ = (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar48._4_4_ = (uint)bVar6 * auVar28._4_4_ | (uint)!bVar6 * auVar27._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar48._8_4_ = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * auVar27._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar48._12_4_ = (uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar27._12_4_;
              auVar62._4_4_ = uVar15;
              auVar62._0_4_ = uVar15;
              auVar62._8_4_ = uVar15;
              auVar62._12_4_ = uVar15;
              uVar22 = vpcmpgtd_avx512vl(auVar62,auVar25);
              uVar22 = uVar22 & 0xf;
              auVar27 = vpblendmd_avx512vl(auVar29,auVar26);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar49._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * uVar15;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar49._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * uVar15;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar49._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * uVar15;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar49._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * uVar15;
              auVar27 = vmovdqa32_avx512vl(auVar29);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar50._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar50._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar50._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar50._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
              auVar27 = vpshufd_avx(auVar50,0xaa);
              auVar28 = vpshufd_avx(auVar48,0xaa);
              uVar22 = vpcmpgtd_avx512vl(auVar27,auVar28);
              uVar22 = uVar22 & 0xf;
              auVar28 = vpblendmd_avx512vl(auVar50,auVar48);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar51._0_4_ = (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar51._4_4_ = (uint)bVar6 * auVar28._4_4_ | (uint)!bVar6 * auVar27._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar51._8_4_ = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * auVar27._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar51._12_4_ = (uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar27._12_4_;
              auVar27 = vmovdqa32_avx512vl(auVar50);
              bVar6 = (bool)((byte)uVar22 & 1);
              auVar52._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * auVar48._0_4_;
              bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
              auVar52._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * auVar48._4_4_;
              bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
              auVar52._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * auVar48._8_4_;
              bVar6 = SUB81(uVar22 >> 3,0);
              auVar52._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * auVar48._12_4_;
              auVar27 = vpshufd_avx(auVar49,0xaa);
              auVar28 = vpshufd_avx(auVar47,0xaa);
              uVar14 = vpcmpgtd_avx512vl(auVar27,auVar28);
              uVar14 = uVar14 & 0xf;
              auVar28 = vpblendmd_avx512vl(auVar49,auVar47);
              bVar6 = (bool)((byte)uVar14 & 1);
              bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
              uVar22 = CONCAT44((uint)bVar7 * auVar28._4_4_ | (uint)!bVar7 * auVar27._4_4_,
                                (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_);
              auVar27 = vmovdqa32_avx512vl(auVar49);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar53._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * auVar47._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar53._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * auVar47._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar53._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * auVar47._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar53._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * auVar47._12_4_;
              auVar27 = vpshufd_avx(auVar53,0xaa);
              auVar28 = vpshufd_avx(auVar51,0xaa);
              uVar14 = vpcmpgtd_avx512vl(auVar28,auVar27);
              uVar14 = uVar14 & 0xf;
              auVar28 = vpblendmd_avx512vl(auVar51,auVar53);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar54._0_4_ = (uint)bVar6 * auVar28._0_4_ | (uint)!bVar6 * auVar27._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar54._4_4_ = (uint)bVar6 * auVar28._4_4_ | (uint)!bVar6 * auVar27._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar54._8_4_ = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * auVar27._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar54._12_4_ = (uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar27._12_4_;
              auVar27 = vmovdqa32_avx512vl(auVar51);
              bVar6 = (bool)((byte)uVar14 & 1);
              auVar55._0_4_ = (uint)bVar6 * auVar27._0_4_ | !bVar6 * auVar53._0_4_;
              bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar55._4_4_ = (uint)bVar6 * auVar27._4_4_ | !bVar6 * auVar53._4_4_;
              bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar55._8_4_ = (uint)bVar6 * auVar27._8_4_ | !bVar6 * auVar53._8_4_;
              bVar6 = SUB81(uVar14 >> 3,0);
              auVar55._12_4_ = (uint)bVar6 * auVar27._12_4_ | !bVar6 * auVar53._12_4_;
              *pauVar13 = auVar52;
              pauVar13[1] = auVar55;
              pauVar13[2] = auVar54;
              pauVar13 = pauVar13 + 3;
            }
          }
        }
      }
      (**(code **)((long)local_1068->leafIntersector +
                  (ulong)*(byte *)(uVar22 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1058,ray,k,context);
      auVar80 = ZEXT1664(local_1018);
      auVar79 = ZEXT1664(local_1008);
      auVar78 = ZEXT1664(local_ff8);
      auVar77 = ZEXT1664(local_fe8);
      auVar76 = ZEXT1664(local_fd8);
      auVar75 = ZEXT1664(local_fc8);
      auVar74 = ZEXT1664(local_fb8);
      auVar73 = ZEXT1664(local_fa8);
      auVar72 = ZEXT1664(local_f98);
      auVar71 = ZEXT1664(local_f88);
      uVar4 = *(undefined4 *)(local_1050 + local_1060 * 4 + 0x80);
      auVar59 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      ray = local_1050;
      k = local_1060;
    }
LAB_006e8da9:
    if (pauVar13 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }